

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::UaddCarryCaseInstance::compare
          (UaddCarryCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  pointer pSVar2;
  long lVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  ostringstream *this_00;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  Hex<8UL> local_38;
  
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar12 = true;
  if (0 < (int)uVar4) {
    uVar6 = (2 << ((&DAT_00b5bd78)[(ulong)uVar9 * 4] - 1 & 0x1f)) - 1;
    uVar9 = **inputs;
    uVar1 = *inputs[1];
    uVar7 = uVar1 + uVar9;
    lVar10 = (ulong)uVar1 + (ulong)uVar9;
    uVar9 = (uint)((ulong)lVar10 >> 0x20);
    if (((**outputs ^ uVar7) & uVar6) == 0) {
      bVar12 = false;
      uVar8 = 0;
      do {
        uVar9 = (uint)((ulong)lVar10 >> 0x20);
        uVar11 = uVar8;
        if (*(uint *)((long)outputs[1] + uVar8 * 4) != uVar9) break;
        if ((ulong)uVar4 - 1 == uVar8) {
          return true;
        }
        uVar11 = uVar8 + 1;
        bVar12 = uVar4 <= uVar11;
        uVar9 = *(uint *)((long)*inputs + (uVar8 + 1) * 4);
        uVar1 = *(uint *)((long)inputs[1] + (uVar8 + 1) * 4);
        uVar7 = uVar1 + uVar9;
        lVar10 = (ulong)uVar1 + (ulong)uVar9;
        uVar9 = (uint)((ulong)lVar10 >> 0x20);
        lVar3 = uVar8 + 1;
        uVar8 = uVar11;
      } while (((*(uint *)((long)*outputs + lVar3 * 4) ^ uVar7) & uVar6) == 0);
    }
    else {
      bVar12 = false;
      uVar11 = 0;
    }
    this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
    local_38.value = (deUint64)uVar7;
    poVar5 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    local_38.value = (deUint64)uVar9;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar5);
  }
  return bVar12;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0+in1;
			const deUint32	ref1	= (deUint64(in0)+deUint64(in1)) > 0xffffffffu ? 1u : 0u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}